

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlwriter.c
# Opt level: O1

int xmlTextWriterWriteBase64(xmlTextWriterPtr writer,char *data,int start,int len)

{
  long lVar1;
  char cVar2;
  int iVar3;
  xmlLinkPtr lk;
  xmlTextWriterStackEntry *p;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  bool bVar9;
  int iVar10;
  bool bVar11;
  uchar igroup [3];
  undefined2 local_4f;
  byte local_4d;
  char local_4c;
  undefined1 local_4b;
  undefined1 local_4a;
  undefined1 local_49;
  int local_48;
  int local_44;
  xmlOutputBufferPtr local_40;
  char *local_38;
  
  iVar8 = -1;
  if (-1 < (len | start) && (data != (char *)0x0 && writer != (xmlTextWriterPtr)0x0)) {
    lk = xmlListFront(writer->nodes);
    local_48 = 0;
    if (((lk != (xmlLinkPtr)0x0) &&
        (p = (xmlTextWriterStackEntry *)xmlLinkGetData(lk), p != (xmlTextWriterStackEntry *)0x0)) &&
       (local_48 = xmlTextWriterHandleStateDependencies(writer,p), local_48 < 0)) {
      return -1;
    }
    if (writer->indent != 0) {
      writer->doindent = 0;
    }
    local_40 = writer->out;
    iVar10 = -1;
    if (data != (char *)0x0 && local_40 != (xmlOutputBufferPtr)0x0) {
      local_38 = data + (uint)start;
      uVar7 = 0;
      iVar8 = 0;
      iVar10 = 0;
      do {
        local_4d = 0;
        local_4f = 0;
        bVar11 = true;
        bVar9 = (int)uVar7 < len;
        if ((int)uVar7 < len) {
          uVar6 = ~uVar7 + len;
          if (1 < uVar6) {
            uVar6 = 2;
          }
          local_44 = iVar8;
          memcpy(&local_4f,local_38 + (int)uVar7,(ulong)(uVar6 + 1));
          uVar4 = 0;
          do {
            lVar1 = (long)(int)uVar7 + 1 + uVar4;
            bVar11 = uVar4 < 2;
            uVar5 = uVar4 + 1;
            bVar9 = lVar1 < len;
            if (1 < uVar4) break;
            uVar4 = uVar5;
          } while (lVar1 < len);
          uVar7 = uVar7 + (int)uVar5;
          iVar8 = local_44;
        }
        else {
          uVar5 = 0;
        }
        if ((int)uVar5 == 0) {
LAB_001b6944:
          cVar2 = (bVar9 ^ 1U) * '\x03';
        }
        else {
          local_4c = xmlOutputBufferWriteBase64_dtable[(byte)local_4f >> 2];
          local_4b = xmlOutputBufferWriteBase64_dtable
                     [(uint)(local_4f._1_1_ >> 4) | ((byte)local_4f & 3) << 4];
          local_4a = xmlOutputBufferWriteBase64_dtable
                     [(uint)(local_4d >> 6) + (local_4f._1_1_ & 0xf) * 4];
          local_49 = xmlOutputBufferWriteBase64_dtable[local_4d & 0x3f];
          if ((bVar11) && (local_49 = 0x3d, (int)uVar5 != 2)) {
            local_4a = 0x3d;
          }
          if (iVar8 < 0x48) {
LAB_001b6921:
            iVar3 = xmlOutputBufferWrite(local_40,4,&local_4c);
            if (iVar3 != -1) {
              iVar10 = iVar10 + iVar3;
              iVar8 = iVar8 + 4;
              goto LAB_001b6944;
            }
          }
          else {
            iVar3 = xmlOutputBufferWrite(local_40,2,"\r\n");
            if (iVar3 != -1) {
              iVar10 = iVar10 + iVar3;
              iVar8 = 0;
              goto LAB_001b6921;
            }
          }
          cVar2 = '\x01';
        }
      } while (cVar2 == '\0');
      if (cVar2 != '\x03') {
        iVar10 = -1;
      }
    }
    iVar8 = -1;
    if (-1 < iVar10) {
      iVar8 = local_48 + iVar10;
    }
  }
  return iVar8;
}

Assistant:

int
xmlTextWriterWriteBase64(xmlTextWriterPtr writer, const char *data,
                         int start, int len)
{
    int count;
    int sum;
    xmlLinkPtr lk;
    xmlTextWriterStackEntry *p;

    if ((writer == NULL) || (data == NULL) || (start < 0) || (len < 0))
        return -1;

    sum = 0;
    lk = xmlListFront(writer->nodes);
    if (lk != 0) {
        p = (xmlTextWriterStackEntry *) xmlLinkGetData(lk);
        if (p != 0) {
            count = xmlTextWriterHandleStateDependencies(writer, p);
            if (count < 0)
                return -1;
            sum += count;
        }
    }

    if (writer->indent)
        writer->doindent = 0;

    count =
        xmlOutputBufferWriteBase64(writer->out, len,
                                   (unsigned char *) data + start);
    if (count < 0)
        return -1;
    sum += count;

    return sum;
}